

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::readHeader(WasmBinaryReader *this)

{
  uint32_t uVar1;
  string local_60;
  string local_40;
  
  verifyInt32(this,0x6d736100);
  uVar1 = getInt32(this);
  if (uVar1 == 1) {
    return;
  }
  if (uVar1 == 0x1000d) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "this looks like a wasm component, which Binaryen does not support yet (see https://github.com/WebAssembly/binaryen/issues/6728)"
               ,"");
    throwError(this,&local_60);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid version","");
  throwError(this,&local_40);
}

Assistant:

void WasmBinaryReader::readHeader() {
  verifyInt32(BinaryConsts::Magic);
  auto version = getInt32();
  if (version != BinaryConsts::Version) {
    if (version == 0x1000d) {
      throwError("this looks like a wasm component, which Binaryen does not "
                 "support yet (see "
                 "https://github.com/WebAssembly/binaryen/issues/6728)");
    }
    throwError("invalid version");
  }
}